

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O0

void __thiscall gimage::GaussKernel::set(GaussKernel *this,float s)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  ulong uVar3;
  void *pvVar4;
  long *in_RDI;
  double dVar5;
  int i_1;
  int i;
  float sum;
  int local_1c;
  int local_18;
  float local_14;
  float local_10;
  float local_c [3];
  
  local_10 = 0.5;
  pfVar2 = std::max<float>(&local_10,local_c);
  local_c[0] = *pfVar2;
  *(int *)(in_RDI + 1) = (int)(local_c[0] * 5.0 + 0.5);
  if ((*(uint *)(in_RDI + 1) & 1) == 0) {
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)in_RDI[1];
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *in_RDI = (long)pvVar4;
  *(int *)((long)in_RDI + 0xc) = (int)in_RDI[1] >> 1;
  local_14 = 0.0;
  for (local_18 = 0; local_18 < (int)in_RDI[1]; local_18 = local_18 + 1) {
    dVar5 = std::exp((double)(ulong)(uint)((float)(-(local_18 - *(int *)((long)in_RDI + 0xc)) *
                                                  (local_18 - *(int *)((long)in_RDI + 0xc))) /
                                          (local_c[0] * 2.0 * local_c[0])));
    *(int *)(*in_RDI + (long)local_18 * 4) = SUB84(dVar5,0);
    local_14 = *(float *)(*in_RDI + (long)local_18 * 4) + local_14;
  }
  for (local_1c = 0; local_1c < (int)in_RDI[1]; local_1c = local_1c + 1) {
    *(float *)(*in_RDI + (long)local_1c * 4) = *(float *)(*in_RDI + (long)local_1c * 4) / local_14;
  }
  return;
}

Assistant:

void set(float s)
    {
      s=std::max(0.5f, s);

      kn=static_cast<int>(5*s+0.5f);

      if ((kn&1) == 0)
      {
        kn++;
      }

      kernel=new float [kn];

      kn2=kn>>1;

      float sum=0;
      for (int i=0; i<kn; i++)
      {
        kernel[i]=static_cast<float>(std::exp(-(i-kn2)*(i-kn2)/(2*s*s)));
        sum+=kernel[i];
      }

      for (int i=0; i<kn; i++)
      {
        kernel[i]/=sum;
      }
    }